

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariableDatum.cpp
# Opt level: O2

void __thiscall DIS::VariableDatum::unmarshal(VariableDatum *this,DataStream *dataStream)

{
  ulong uVar1;
  EightByteChunk x;
  EightByteChunk EStack_38;
  
  DataStream::operator>>(dataStream,&this->_variableDatumID);
  DataStream::operator>>(dataStream,&this->_variableDatumLength);
  this->_variableDatumLength =
       ((this->_variableDatumLength >> 6) + 1) - (uint)((this->_variableDatumLength & 0x3f) == 0);
  std::vector<DIS::EightByteChunk,_std::allocator<DIS::EightByteChunk>_>::clear
            (&this->_variableDatums);
  for (uVar1 = 0; uVar1 < this->_variableDatumLength; uVar1 = uVar1 + 1) {
    EightByteChunk::EightByteChunk(&EStack_38);
    EightByteChunk::unmarshal(&EStack_38,dataStream);
    std::vector<DIS::EightByteChunk,_std::allocator<DIS::EightByteChunk>_>::push_back
              (&this->_variableDatums,&EStack_38);
    EightByteChunk::~EightByteChunk(&EStack_38);
  }
  return;
}

Assistant:

void VariableDatum::unmarshal(DataStream& dataStream)
{
    dataStream >> _variableDatumID;
    dataStream >> _variableDatumLength;
    _variableDatumLength = (_variableDatumLength / 64) + ((_variableDatumLength % 64) > 0);

     _variableDatums.clear();
     for(size_t idx = 0; idx < _variableDatumLength; idx++)
     {
        EightByteChunk x;
        x.unmarshal(dataStream);
        _variableDatums.push_back(x);
     }
}